

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall mjs::object::object(object *this,string *class_name,object_ptr *prototype)

{
  gc_heap *pgVar1;
  gc_heap_ptr<mjs::gc_string> *p;
  undefined1 local_30 [24];
  object_ptr *prototype_local;
  string *class_name_local;
  object *this_local;
  
  this->_vptr_object = (_func_int **)&PTR_get_00296950;
  local_30._16_8_ = prototype;
  prototype_local = (object_ptr *)class_name;
  class_name_local = (string *)this;
  pgVar1 = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)class_name);
  this->heap_ = pgVar1;
  p = string::unsafe_raw_get((string *)prototype_local);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::gc_heap_ptr_untracked(&this->class_,p);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked
            (&this->prototype_,(gc_heap_ptr<mjs::object> *)local_30._16_8_);
  gc_vector<mjs::object::property>::make((gc_heap *)local_30,(uint32_t)this->heap_);
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::gc_heap_ptr_untracked
            (&this->properties_,(gc_heap_ptr<mjs::gc_vector<mjs::object::property>_> *)local_30);
  gc_heap_ptr<mjs::gc_vector<mjs::object::property>_>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::gc_vector<mjs::object::property>_> *)local_30);
  this->extensible_ = true;
  return;
}

Assistant:

object::object(const string& class_name, const object_ptr& prototype)
    : heap_{class_name.heap()} // A class will always have a class_name - grab heap from that
    , class_{class_name.unsafe_raw_get()}
    , prototype_{prototype}
    , properties_{gc_vector<property>::make(heap_, 4)}
    , extensible_{true} {
}